

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextUpdateUndocking(ImGuiContext *ctx)

{
  ImGuiDockNode *this;
  bool bVar1;
  ImGuiDockContext *this_00;
  ImGuiStoragePair *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiDockRequest *req;
  int n_1;
  ImGuiDockNode *node;
  int n;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiContext *ctx_local;
  
  this_00 = &ctx->DockContext;
  if (((ctx->IO).ConfigFlags & 0x40U) == 0) {
    if ((0 < (this_00->Nodes).Data.Size) || (0 < (ctx->DockContext).Requests.Size)) {
      DockContextClearNodes(ctx,0,true);
    }
  }
  else {
    if (((ctx->IO).ConfigDockingNoSplit & 1U) != 0) {
      for (node._4_4_ = 0; node._4_4_ < (this_00->Nodes).Data.Size; node._4_4_ = node._4_4_ + 1) {
        pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                           ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this_00,node._4_4_);
        this = (ImGuiDockNode *)(pIVar2->field_1).val_p;
        if (((this != (ImGuiDockNode *)0x0) && (bVar1 = ImGuiDockNode::IsRootNode(this), bVar1)) &&
           (bVar1 = ImGuiDockNode::IsSplitNode(this), bVar1)) {
          DockBuilderRemoveNodeChildNodes(this->ID);
        }
      }
    }
    if (((ctx->DockContext).WantFullRebuild & 1U) != 0) {
      DockContextRebuildNodes(ctx);
      (ctx->DockContext).WantFullRebuild = false;
    }
    for (req._4_4_ = 0; req._4_4_ < (ctx->DockContext).Requests.Size; req._4_4_ = req._4_4_ + 1) {
      pIVar3 = ImVector<ImGuiDockRequest>::operator[](&(ctx->DockContext).Requests,req._4_4_);
      if ((pIVar3->Type == ImGuiDockRequestType_Undock) &&
         (pIVar3->UndockTargetWindow != (ImGuiWindow *)0x0)) {
        DockContextProcessUndockWindow(ctx,pIVar3->UndockTargetWindow,true);
      }
      else if ((pIVar3->Type == ImGuiDockRequestType_Undock) &&
              (pIVar3->UndockTargetNode != (ImGuiDockNode *)0x0)) {
        DockContextProcessUndockNode(ctx,pIVar3->UndockTargetNode);
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}